

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkPutOnTop(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtk2)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  int iVar3;
  Abc_Ntk_t *pNtkNew;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcStrash.c"
                  ,0x31d,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk2->ntkType == ABC_NTK_LOGIC) {
    if (pNtk->vPos->nSize != pNtk2->vPis->nSize) {
      __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPiNum(pNtk2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcStrash.c"
                    ,799,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    Abc_NtkCleanCopy(pNtk);
    Abc_NtkCleanCopy(pNtk2);
    pNtkNew = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
    pcVar4 = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pName = pcVar4;
    pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
    pNtkNew->pSpec = pcVar4;
    pVVar5 = pNtk->vPis;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar5->pArray[lVar7],1);
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk->vPis;
      } while (lVar7 < pVVar5->nSize);
    }
    pVVar5 = Abc_NtkDfs(pNtk,0);
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
        Abc_NtkDupObj(pNtkNew,pAVar1,0);
        if (0 < (pAVar1->vFanins).nSize) {
          lVar6 = 0;
          do {
            Abc_ObjAddFanin((pAVar1->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar6]] +
                             0x40));
            lVar6 = lVar6 + 1;
          } while (lVar6 < (pAVar1->vFanins).nSize);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar5->nSize);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
    }
    free(pVVar5);
    pVVar5 = pNtk2->vPis;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        if (pNtk->vPos->nSize <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        plVar2 = (long *)pNtk->vPos->pArray[lVar7];
        *(ulong *)((long)pVVar5->pArray[lVar7] + 0x40) =
             (ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
             *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                 (long)*(int *)plVar2[4] * 8) + 0x40);
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk2->vPis;
      } while (lVar7 < pVVar5->nSize);
    }
    pVVar5 = Abc_NtkDfs(pNtk2,0);
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
        Abc_NtkDupObj(pNtkNew,pAVar1,0);
        if (0 < (pAVar1->vFanins).nSize) {
          lVar6 = 0;
          do {
            Abc_ObjAddFanin((pAVar1->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar6]] +
                             0x40));
            lVar6 = lVar6 + 1;
          } while (lVar6 < (pAVar1->vFanins).nSize);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar5->nSize);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
    }
    free(pVVar5);
    pVVar5 = pNtk2->vPos;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
        Abc_NtkDupObj(pNtkNew,pAVar1,1);
        Abc_ObjAddFanin((pAVar1->field_6).pCopy,
                        (Abc_Obj_t *)
                        ((ulong)(*(uint *)&pAVar1->field_0x14 >> 10 & 1) ^
                        *(ulong *)((long)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray] +
                                  0x40)));
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk2->vPos;
      } while (lVar7 < pVVar5->nSize);
    }
    iVar3 = Abc_NtkCheck(pNtkNew);
    if (iVar3 == 0) {
      fwrite("Abc_NtkPutOnTop(): Network check has failed.\n",0x2d,1,_stdout);
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcStrash.c"
                ,0x31e,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkPutOnTop( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtk2 )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkIsLogic(pNtk2) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPiNum(pNtk2) );
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkCleanCopy( pNtk2 );
    // duplicate the name and the spec
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // add internal nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // transfer to the POs
    Abc_NtkForEachPi( pNtk2, pObj, i )
        pObj->pCopy = Abc_ObjChild0Copy( Abc_NtkPo(pNtk, i) );
    // add internal nodes
    vNodes = Abc_NtkDfs( pNtk2, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPo( pNtk2, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkPutOnTop(): Network check has failed.\n" );
    return pNtkNew;
}